

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cc
# Opt level: O1

void __thiscall FIX::double_conversion::Bignum::AssignBignum(Bignum *this,Bignum *other)

{
  uint *puVar1;
  uint uVar2;
  uint *puVar3;
  uint uVar4;
  long lVar5;
  
  this->exponent_ = other->exponent_;
  uVar2 = other->used_digits_;
  if (0 < (int)uVar2) {
    puVar3 = (other->bigits_).start_;
    puVar1 = (this->bigits_).start_;
    lVar5 = 0;
    do {
      if (((other->bigits_).length_ <= lVar5) || ((this->bigits_).length_ <= lVar5))
      goto LAB_001659fc;
      puVar1[lVar5] = puVar3[lVar5];
      lVar5 = lVar5 + 1;
      uVar2 = other->used_digits_;
    } while (lVar5 < (int)uVar2);
  }
  if ((int)uVar2 < this->used_digits_) {
    puVar3 = (this->bigits_).start_ + uVar2;
    uVar4 = uVar2;
    do {
      if (((int)uVar2 < 0) || ((this->bigits_).length_ <= (int)uVar4)) {
LAB_001659fc:
        __assert_fail("0 <= index && index < length_",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/utils.h"
                      ,0xca,
                      "T &FIX::double_conversion::Vector<unsigned int>::operator[](int) const [T = unsigned int]"
                     );
      }
      *puVar3 = 0;
      uVar4 = uVar4 + 1;
      puVar3 = puVar3 + 1;
    } while ((int)uVar4 < this->used_digits_);
  }
  this->used_digits_ = other->used_digits_;
  return;
}

Assistant:

void Bignum::AssignBignum(const Bignum& other) {
  exponent_ = other.exponent_;
  for (int i = 0; i < other.used_digits_; ++i) {
    bigits_[i] = other.bigits_[i];
  }
  // Clear the excess digits (if there were any).
  for (int i = other.used_digits_; i < used_digits_; ++i) {
    bigits_[i] = 0;
  }
  used_digits_ = other.used_digits_;
}